

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_fill_extcomplex_module
              (ly_ctx *ctx,lys_ext_instance_complex *ext,char *parent_name,char **values,
              int implemented)

{
  void *__ptr;
  int iVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  lys_module *plVar5;
  LY_ERR *pLVar6;
  LY_ECODE code;
  long lVar7;
  long lVar8;
  lyext_substmt *local_50;
  lyext_substmt *info;
  char *local_40;
  int local_34;
  
  if (values == (char **)0x0) {
LAB_0014de77:
    iVar1 = 0;
  }
  else {
    info = (lyext_substmt *)ctx;
    local_34 = implemented;
    plVar2 = (long *)lys_ext_complex_get_substmt(LY_STMT_MODULE,ext,&local_50);
    if (plVar2 == (long *)0x0) {
      code = LYE_INCHILDSTMT;
LAB_0014dea0:
      ly_vlog(code,LY_VLOG_NONE,(void *)0x0,"module",parent_name);
    }
    else {
      lVar8 = 0;
      plVar4 = plVar2;
      local_40 = parent_name;
      do {
        if (values[lVar8] == (char *)0x0) goto LAB_0014de77;
        if (local_50->cardinality < LY_STMT_CARD_SOME) {
          if (*plVar4 != 0) {
            code = LYE_TOOMANY;
            parent_name = local_40;
            goto LAB_0014dea0;
          }
LAB_0014de4d:
          lVar7 = 0;
        }
        else {
          __ptr = (void *)*plVar2;
          if (__ptr == (void *)0x0) {
            plVar4 = (long *)calloc(2,8);
            *plVar2 = (long)plVar4;
            goto LAB_0014de4d;
          }
          lVar3 = 0;
          for (lVar7 = 0; *(long *)((long)__ptr + lVar7 * 8) != 0; lVar7 = lVar7 + 1) {
            lVar3 = lVar3 + -8;
          }
          if ((int)lVar7 == 0) {
            plVar4 = (long *)((long)__ptr - lVar3);
            goto LAB_0014de4d;
          }
          plVar4 = (long *)realloc(__ptr,0x10 - lVar3);
          if (plVar4 == (long *)0x0) {
            pLVar6 = ly_errno_location();
            *pLVar6 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_extcomplex_module");
            break;
          }
          *plVar2 = (long)plVar4;
          plVar4[lVar7 + 1] = 0;
        }
        plVar5 = yang_read_module((ly_ctx *)info,values[lVar8],0,(char *)0x0,local_34);
        plVar4[lVar7] = (long)plVar5;
        lVar8 = lVar8 + 1;
      } while (plVar5 != (lys_module *)0x0);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
yang_fill_extcomplex_module(struct ly_ctx *ctx, struct lys_ext_instance_complex *ext,
                            char *parent_name, char **values, int implemented)
{
    int c, i;
    struct lys_module **modules, ***p, *reallocated, **pp;
    struct lyext_substmt *info;

    if (!values) {
        return EXIT_SUCCESS;
    }
    pp = modules = lys_ext_complex_get_substmt(LY_STMT_MODULE, ext, &info);
    if (!modules) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "module", parent_name);
        return EXIT_FAILURE;
    }

    for (i = 0; values[i]; ++i) {
        c = 0;
        if (info->cardinality < LY_STMT_CARD_SOME && *modules) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "module", parent_name);
            return EXIT_FAILURE;
        }
        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, so instead of pointer to array,
             * we have in modules pointer to pointer to array */
            p = (struct lys_module ***)pp;
            modules = *p;
            if (!modules) {
                /* allocate initial array */
                *p = modules = calloc(2, sizeof(struct lys_module *));
            } else {
                for (c = 0; *modules; modules++, c++);
            }
        }

        if (c) {
            /* enlarge the array */
            reallocated = realloc(*p, (c + 2) * sizeof(struct lys_module *));
            if (!reallocated) {
                LOGMEM;
                return EXIT_FAILURE;
            }
            *p = (struct lys_module **)reallocated;
            modules = *p;
            modules[c + 1] = NULL;
        }

        modules[c] = yang_read_module(ctx, values[i], 0, NULL, implemented);
        if (!modules[c]) {
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}